

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

void crnlib::get_command_line_as_single_string(dynamic_string *cmd_line,int argc,char **argv)

{
  char cVar1;
  uint uVar2;
  dynamic_string local_68;
  dynamic_string local_58 [2];
  undefined1 local_38 [8];
  dynamic_string tmp;
  int i;
  char **argv_local;
  int argc_local;
  dynamic_string *cmd_line_local;
  
  dynamic_string::clear(cmd_line);
  for (tmp.m_pStr._4_4_ = 0; tmp.m_pStr._4_4_ < argc; tmp.m_pStr._4_4_ = tmp.m_pStr._4_4_ + 1) {
    dynamic_string::dynamic_string((dynamic_string *)local_38,argv[tmp.m_pStr._4_4_]);
    cVar1 = dynamic_string::front((dynamic_string *)local_38);
    if (cVar1 != '\"') {
      cVar1 = dynamic_string::front((dynamic_string *)local_38);
      if (cVar1 != '-') {
        cVar1 = dynamic_string::front((dynamic_string *)local_38);
        if (cVar1 != '@') {
          operator+((crnlib *)&local_68,"\"",(dynamic_string *)local_38);
          operator+((crnlib *)local_58,&local_68,"\"");
          dynamic_string::operator=((dynamic_string *)local_38,local_58);
          dynamic_string::~dynamic_string(local_58);
          dynamic_string::~dynamic_string(&local_68);
        }
      }
    }
    uVar2 = dynamic_string::get_len(cmd_line);
    if (uVar2 != 0) {
      dynamic_string::operator+=(cmd_line," ");
    }
    dynamic_string::operator+=(cmd_line,(dynamic_string *)local_38);
    dynamic_string::~dynamic_string((dynamic_string *)local_38);
  }
  return;
}

Assistant:

void get_command_line_as_single_string(dynamic_string& cmd_line, int argc, char* argv[]) {
  argc, argv;
#if CRNLIB_USE_WIN32_API
  cmd_line.set(GetCommandLineA());
#else
  cmd_line.clear();
  for (int i = 0; i < argc; i++) {
    dynamic_string tmp(argv[i]);
    if ((tmp.front() != '"') && (tmp.front() != '-') && (tmp.front() != '@'))
      tmp = "\"" + tmp + "\"";
    if (cmd_line.get_len())
      cmd_line += " ";
    cmd_line += tmp;
  }
#endif
}